

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall punky::par::Parser::peek_error(Parser *this,TokenType *type)

{
  TokenType *in_RDX;
  TokenType *type_00;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  tok::type_to_string_abi_cxx11_(&local_30,(tok *)type,in_RDX);
  std::operator+(&local_b0,"Expected next token to be ",&local_30);
  std::operator+(&local_90,&local_b0,", but got ");
  tok::type_to_string_abi_cxx11_(&local_d0,(tok *)&this->m_peek_tok,type_00);
  std::operator+(&local_70,&local_90,&local_d0);
  std::operator+(&local_50,&local_70," instead");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_errors,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Parser::peek_error(const TokenType& type)
{
    m_errors.emplace_back("Expected next token to be "
                          + tok::type_to_string(type)
                          + ", but got "
                          + tok::type_to_string(m_peek_tok.m_type)
                          + " instead");
}